

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *
wasm::WATParser::anon_unknown_0::str
          (optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *__return_storage_ptr__,
          string_view in)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  ostream *os;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  size_t sVar4;
  char cVar5;
  OverflowBehavior in_R8D;
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *poVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  string_view sVar8;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  string_view sv_08;
  string_view in_00;
  undefined1 auStack_3a8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  undefined1 local_220 [8];
  LexStrCtx ctx;
  char local_68;
  undefined1 auStack_50 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> basic;
  
  ctx.super_LexCtx.input._M_len = (size_t)in._M_str;
  local_220 = (undefined1  [8])in._M_len;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  ctx.escapeBuilder.
  super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload.field2[0x180] = 0;
  sVar8._M_str = "\"";
  sVar8._M_len = 1;
  basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = __return_storage_ptr__;
  bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sVar8);
  if (bVar1) {
    os = (ostream *)
         ((long)&ctx.escapeBuilder.
                 super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 8);
LAB_00c00ff7:
    sv._M_str = "\"";
    sv._M_len = 1;
    bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv);
    if (!bVar1) {
      if (local_220 == (undefined1  [8])ctx.super_LexCtx.input._M_str) goto LAB_00c012e8;
      sv_00._M_str = "\\";
      sv_00._M_len = 1;
      sVar4 = LexCtx::startsWith((LexCtx *)local_220,sv_00);
      if (sVar4 != 0) {
        if (ctx.escapeBuilder.
            super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload.field2[0x180] == '\0') {
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_3a8);
          std::optional<std::__cxx11::stringstream>::operator=
                    ((optional<std::__cxx11::stringstream> *)&ctx.super_LexCtx.lexedSize,
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_3a8);
          std::__cxx11::stringstream::~stringstream((stringstream *)auStack_3a8);
          LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)auStack_3a8,
                        (LexCtx *)local_220);
          bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_3a8,1,
                             0xffffffffffffffff);
          std::__ostream_insert<char,std::char_traits<char>>(os,bVar7._M_str,bVar7._M_len);
        }
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
        sv_01._M_str = "t";
        sv_01._M_len = 1;
        bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv_01);
        cVar5 = '\t';
        if (!bVar1) {
          sv_02._M_str = "n";
          sv_02._M_len = 1;
          bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv_02);
          cVar5 = '\n';
          if (!bVar1) {
            sv_03._M_str = "r";
            sv_03._M_len = 1;
            bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv_03);
            cVar5 = '\r';
            if (!bVar1) {
              sv_04._M_str = "\\";
              sv_04._M_len = 1;
              bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv_04);
              cVar5 = '\\';
              if (!bVar1) {
                sv_05._M_str = "\"";
                sv_05._M_len = 1;
                bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv_05);
                cVar5 = '\"';
                if (!bVar1) {
                  sv_06._M_str = "\'";
                  sv_06._M_len = 1;
                  bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv_06);
                  cVar5 = '\'';
                  if (!bVar1) {
                    sv_07._M_str = "u{";
                    sv_07._M_len = 2;
                    bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv_07);
                    if (bVar1) {
                      sVar8 = LexCtx::next((LexCtx *)local_220);
                      in_00._M_len = sVar8._M_str;
                      in_00._M_str = (char *)0x0;
                      hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                             auStack_3a8,(anon_unknown_0 *)sVar8._M_len,in_00,in_R8D);
                      if (lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                          ._M_payload._M_value.sign._0_1_ == '\0') goto LAB_00c012e8;
                      ctx.super_LexCtx.input._M_str =
                           ctx.super_LexCtx.input._M_str + (long)auStack_3a8;
                      sv_08._M_str = "}";
                      sv_08._M_len = 1;
                      bVar1 = LexCtx::takePrefix((LexCtx *)local_220,sv_08);
                      if (((!bVar1) ||
                          ((char *)((long)DWORD_ARRAY_00108248 + 0x7db7U) <
                           lexed.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                           ._M_payload._M_value.super_LexResult.span._M_str)) ||
                         (((ulong)lexed.
                                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                  ._M_payload._M_value.super_LexResult.span._M_str &
                          0xfffffffffffff800) == 0xd800)) goto LAB_00c012e8;
                      String::writeWTF8CodePoint
                                (os,(uint32_t)
                                    lexed.
                                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                    ._M_payload._M_value.super_LexResult.span._M_str);
                    }
                    else {
                      _auStack_3a8 = LexCtx::next((LexCtx *)local_220);
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.super_LexResult.span._M_str = (char *)0x0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.n._0_5_ = 0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._21_4_ = 0;
                      lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._25_4_ = 0;
                      bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)auStack_3a8);
                      if (!bVar1) goto LAB_00c012e8;
                      bVar1 = LexIntCtx::takeHexdigit((LexIntCtx *)auStack_3a8);
                      if (!bVar1) goto LAB_00c012e8;
                      LexIntCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                        *)&ctx.escapeBuilder.
                                           super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ._M_engaged,(LexIntCtx *)auStack_3a8);
                      ctx.super_LexCtx.input._M_str =
                           ctx.super_LexCtx.input._M_str +
                           ctx.escapeBuilder.
                           super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._392_8_;
                      std::operator<<(os,local_68);
                    }
                    goto LAB_00c00ff7;
                  }
                }
              }
            }
          }
        }
        std::operator<<(os,cVar5);
        goto LAB_00c00ff7;
      }
      bVar2 = LexCtx::peek((LexCtx *)local_220);
      if ((bVar2 < 0x20) || (bVar2 == 0x7f)) goto LAB_00c012e8;
      if (ctx.escapeBuilder.
          super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload.field2[0x180] == '\x01') {
        uVar3 = LexCtx::peek((LexCtx *)local_220);
        std::operator<<(os,uVar3);
      }
      ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
      goto LAB_00c00ff7;
    }
    LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)auStack_50,
                  (LexCtx *)local_220);
    poVar6 = (optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
             basic.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
             _M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_;
    if (basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._8_1_ == '\x01') {
      if (ctx.escapeBuilder.
          super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload.field2[0x180] == '\x01') {
        lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._0_8_ =
             basic.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
             _M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
             _M_payload._M_value.span._M_len;
        auStack_3a8 = auStack_50;
        std::__cxx11::stringbuf::str();
        this = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&lexed.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                          ._M_payload._M_value.super_LexResult.span + 8);
        __t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &ctx.escapeBuilder.
               super__Optional_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_engaged;
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,__t);
        poVar6 = (optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                 basic.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _16_8_;
        std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::
        optional<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true>
                  ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                   basic.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _16_8_,(LexStrResult *)auStack_3a8);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(this);
        std::__cxx11::string::~string((string *)__t);
      }
      else {
        lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._0_8_ =
             basic.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
             _M_payload.
             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
             _M_payload._M_value.span._M_len;
        auStack_3a8 = auStack_50;
        std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::
        optional<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true>
                  ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                   basic.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _16_8_,(LexStrResult *)auStack_3a8);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&lexed.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                              ._M_payload._M_value.super_LexResult.span + 8));
      }
      goto LAB_00c012f1;
    }
  }
LAB_00c012e8:
  *(undefined1 *)
   (basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
    _16_8_ + 0x38) = 0;
  poVar6 = (optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
           basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
           ._M_payload.
           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_;
LAB_00c012f1:
  std::
  _Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ctx.super_LexCtx.lexedSize);
  return poVar6;
}

Assistant:

std::optional<LexStrResult> str(std::string_view in) {
  LexStrCtx ctx(in);
  if (!ctx.takePrefix("\""sv)) {
    return {};
  }
  while (!ctx.takePrefix("\""sv)) {
    if (ctx.empty()) {
      // TODO: Add error production for unterminated string.
      return {};
    }
    if (ctx.startsWith("\\"sv)) {
      // Escape sequences
      ctx.ensureBuildingEscaped();
      ctx.take(1);
      if (ctx.takePrefix("t"sv)) {
        ctx.appendEscaped('\t');
      } else if (ctx.takePrefix("n"sv)) {
        ctx.appendEscaped('\n');
      } else if (ctx.takePrefix("r"sv)) {
        ctx.appendEscaped('\r');
      } else if (ctx.takePrefix("\\"sv)) {
        ctx.appendEscaped('\\');
      } else if (ctx.takePrefix("\""sv)) {
        ctx.appendEscaped('"');
      } else if (ctx.takePrefix("'"sv)) {
        ctx.appendEscaped('\'');
      } else if (ctx.takePrefix("u{"sv)) {
        auto lexed = hexnum(ctx.next());
        if (!lexed) {
          // TODO: Add error production for malformed unicode escapes.
          return {};
        }
        ctx.take(*lexed);
        if (!ctx.takePrefix("}"sv)) {
          // TODO: Add error production for malformed unicode escapes.
          return {};
        }
        if (!ctx.appendUnicode(lexed->n)) {
          // TODO: Add error production for invalid unicode values.
          return {};
        }
      } else {
        LexIntCtx ictx(ctx.next());
        if (!ictx.takeHexdigit() || !ictx.takeHexdigit()) {
          // TODO: Add error production for unrecognized escape sequence.
          return {};
        }
        auto lexed = *ictx.lexed();
        ctx.take(lexed);
        ctx.appendEscaped(char(lexed.n));
      }
    } else {
      // Normal characters
      if (uint8_t c = ctx.peek(); c >= 0x20 && c != 0x7F) {
        ctx.takeChar();
      } else {
        // TODO: Add error production for unescaped control characters.
        return {};
      }
    }
  }
  return ctx.lexed();
}